

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * pbrt::detail::
         DispatchCPU<pbrt::RayMajorantIterator::ToString[abi:cxx11]()const::__0&,std::__cxx11::string,pbrt::HomogeneousMajorantIterator,pbrt::DDAMajorantIterator>
                   (anon_class_1_0_00000001 *func,void *ptr,int index)

{
  int in_ECX;
  string *in_RDI;
  
  if (in_ECX == 0) {
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(HomogeneousMajorantIterator *)in_RDI);
  }
  else {
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(DDAMajorantIterator *)in_RDI);
  }
  return in_RDI;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 2);

    if (index == 0)
        return func((const T0 *)ptr);
    else
        return func((const T1 *)ptr);
}